

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::
SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
::TearDown(SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
           *this)

{
  bool bVar1;
  SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
  *in_RDI;
  
  bVar1 = use_high_bit_depth(in_RDI);
  if (bVar1) {
    aom_free(in_RDI);
    aom_free(in_RDI);
    aom_free(in_RDI);
  }
  else {
    aom_free(in_RDI);
    aom_free(in_RDI);
    aom_free(in_RDI);
  }
  return;
}

Assistant:

void TearDown() override {
    if (!use_high_bit_depth()) {
      aom_free(src_);
      aom_free(ref_);
      aom_free(sec_);
    } else {
      aom_free(CONVERT_TO_SHORTPTR(src_));
      aom_free(CONVERT_TO_SHORTPTR(ref_));
      aom_free(CONVERT_TO_SHORTPTR(sec_));
    }
  }